

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O3

void __thiscall FPatchTexture::~FPatchTexture(FPatchTexture *this)

{
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPatchTexture_0070a208;
  if (this->Pixels != (BYTE *)0x0) {
    operator_delete__(this->Pixels);
    this->Pixels = (BYTE *)0x0;
  }
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FPatchTexture::~FPatchTexture ()
{
	Unload ();
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
}